

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cc
# Opt level: O3

void __thiscall hrvo::KdTree::queryRecursive(KdTree *this,Agent *agent,float *rangeSq,size_t node)

{
  size_t node_00;
  pointer pNVar1;
  size_t *psVar2;
  pointer pNVar3;
  size_t i;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar10;
  undefined1 auVar9 [16];
  
  pNVar3 = (this->nodes_).
           super__Vector_base<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = pNVar3[node].begin_;
  if (10 < pNVar3[node].end_ - sVar4) {
    pNVar1 = pNVar3 + node;
    do {
      sVar4 = pNVar1->left_;
      node_00 = pNVar1->right_;
      fVar8 = (agent->position_).x_;
      fVar10 = (agent->position_).y_;
      auVar6._0_4_ = pNVar3[sVar4].minX_ - fVar8;
      auVar6._4_4_ = pNVar3[node_00].minX_ - fVar8;
      auVar6._8_4_ = 0.0 - fVar8;
      auVar6._12_4_ = 0.0 - fVar8;
      auVar6 = maxps(auVar6,ZEXT816(0));
      auVar7._0_4_ = fVar8 - pNVar3[sVar4].maxX_;
      auVar7._4_4_ = fVar8 - pNVar3[node_00].maxX_;
      auVar7._8_4_ = fVar8 - 0.0;
      auVar7._12_4_ = fVar8 - 0.0;
      auVar7 = maxps(auVar7,ZEXT816(0));
      auVar5._0_4_ = pNVar3[sVar4].minY_ - fVar10;
      auVar5._4_4_ = pNVar3[node_00].minY_ - fVar10;
      auVar5._8_4_ = 0.0 - fVar10;
      auVar5._12_4_ = 0.0 - fVar10;
      auVar5 = maxps(auVar5,ZEXT816(0));
      auVar9._0_4_ = fVar10 - pNVar3[sVar4].maxY_;
      auVar9._4_4_ = fVar10 - pNVar3[node_00].maxY_;
      auVar9._8_4_ = fVar10 - 0.0;
      auVar9._12_4_ = fVar10 - 0.0;
      auVar9 = maxps(auVar9,ZEXT816(0));
      fVar8 = auVar9._0_4_ * auVar9._0_4_ +
              auVar5._0_4_ * auVar5._0_4_ +
              auVar6._0_4_ * auVar6._0_4_ + auVar7._0_4_ * auVar7._0_4_;
      fVar10 = auVar9._4_4_ * auVar9._4_4_ +
               auVar5._4_4_ * auVar5._4_4_ +
               auVar6._4_4_ * auVar6._4_4_ + auVar7._4_4_ * auVar7._4_4_;
      if (fVar10 <= fVar8) {
        if (*rangeSq <= fVar10) {
          return;
        }
        queryRecursive(this,agent,rangeSq,node_00);
        if (*rangeSq <= fVar8) {
          return;
        }
        pNVar3 = (this->nodes_).
                 super__Vector_base<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>._M_impl
                 .super__Vector_impl_data._M_start;
        psVar2 = &pNVar3[node].left_;
      }
      else {
        if (*rangeSq <= fVar8) {
          return;
        }
        queryRecursive(this,agent,rangeSq,sVar4);
        if (*rangeSq <= fVar10) {
          return;
        }
        pNVar3 = (this->nodes_).
                 super__Vector_base<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>._M_impl
                 .super__Vector_impl_data._M_start;
        psVar2 = &pNVar3[node].right_;
      }
      node = *psVar2;
      pNVar1 = pNVar3 + node;
      sVar4 = pNVar3[node].begin_;
    } while (10 < pNVar3[node].end_ - sVar4);
  }
  if (sVar4 < pNVar3[node].end_) {
    do {
      Agent::insertNeighbor
                (agent,(this->agents_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar4],rangeSq);
      sVar4 = sVar4 + 1;
    } while (sVar4 < (this->nodes_).
                     super__Vector_base<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>.
                     _M_impl.super__Vector_impl_data._M_start[node].end_);
  }
  return;
}

Assistant:

void KdTree::queryRecursive(Agent *agent, float &rangeSq,
                            std::size_t node) const {
  if (nodes_[node].end_ - nodes_[node].begin_ <= HRVO_MAX_LEAF_SIZE) {
    for (std::size_t i = nodes_[node].begin_; i < nodes_[node].end_; ++i) {
      agent->insertNeighbor(agents_[i], rangeSq);
    }
  } else {
    const float distLeftMinX = std::max(
        0.0F, nodes_[nodes_[node].left_].minX_ - agent->position_.getX());
    const float distLeftMaxX = std::max(
        0.0F, agent->position_.getX() - nodes_[nodes_[node].left_].maxX_);
    const float distLeftMinY = std::max(
        0.0F, nodes_[nodes_[node].left_].minY_ - agent->position_.getY());
    const float distLeftMaxY = std::max(
        0.0F, agent->position_.getY() - nodes_[nodes_[node].left_].maxY_);

    const float distSqLeft =
        distLeftMinX * distLeftMinX + distLeftMaxX * distLeftMaxX +
        distLeftMinY * distLeftMinY + distLeftMaxY * distLeftMaxY;

    const float distRightMinX = std::max(
        0.0F, nodes_[nodes_[node].right_].minX_ - agent->position_.getX());
    const float distRightMaxX = std::max(
        0.0F, agent->position_.getX() - nodes_[nodes_[node].right_].maxX_);
    const float distRightMinY = std::max(
        0.0F, nodes_[nodes_[node].right_].minY_ - agent->position_.getY());
    const float distRightMaxY = std::max(
        0.0F, agent->position_.getY() - nodes_[nodes_[node].right_].maxY_);

    const float distSqRight =
        distRightMinX * distRightMinX + distRightMaxX * distRightMaxX +
        distRightMinY * distRightMinY + distRightMaxY * distRightMaxY;

    if (distSqLeft < distSqRight) {
      if (distSqLeft < rangeSq) {
        queryRecursive(agent, rangeSq, nodes_[node].left_);

        if (distSqRight < rangeSq) {
          queryRecursive(agent, rangeSq, nodes_[node].right_);
        }
      }
    } else {
      if (distSqRight < rangeSq) {
        queryRecursive(agent, rangeSq, nodes_[node].right_);

        if (distSqLeft < rangeSq) {
          queryRecursive(agent, rangeSq, nodes_[node].left_);
        }
      }
    }
  }
}